

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  WhereClause *pWVar4;
  WhereLoop *pTemplate;
  SrcList *pSVar5;
  WhereOrInfo *pWVar6;
  WhereTerm *pWVar7;
  ulong uVar8;
  bool bVar9;
  LogEst rRun;
  LogEst nOut;
  int iVar10;
  WhereTerm *pWVar11;
  WhereTerm *pWVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  WhereTerm *pWVar16;
  LogEst *pLVar17;
  ulong uVar18;
  WhereLoopBuilder local_338;
  WhereOrSet sSum;
  WhereOrSet sCur;
  ulong local_288;
  LogEst local_280 [20];
  WhereClause tempWC;
  
  pWVar4 = pBuilder->pWC;
  pTemplate = pBuilder->pNew;
  pWVar16 = pWVar4->a;
  pWVar11 = pWVar16 + pWVar4->nTerm;
  sSum.a[1].rRun = 0;
  sSum.a[1].nOut = 0;
  sSum.a[1]._12_4_ = 0;
  sSum.a[2].prereq = 0;
  sSum.a[0].rRun = 0;
  sSum.a[0].nOut = 0;
  sSum.a[0]._12_4_ = 0;
  sSum.a[1].prereq = 0;
  sSum.n = 0;
  sSum._2_6_ = 0;
  sSum.a[0].prereq = 0;
  sSum.a[2].rRun = 0;
  sSum.a[2].nOut = 0;
  sSum.a[2]._12_4_ = 0;
  pSVar5 = pBuilder->pWInfo->pTabList;
  bVar1 = pTemplate->iTab;
  iVar2 = pSVar5->a[bVar1].iCursor;
  iVar10 = 0;
  do {
    if ((iVar10 != 0) || (pWVar11 <= pWVar16)) {
      return iVar10;
    }
    iVar10 = 0;
    if (((pWVar16->eOperator & 0x200) != 0) &&
       (pWVar6 = (pWVar16->u).pOrInfo, (pWVar6->indexable & pTemplate->maskSelf) != 0)) {
      iVar3 = (pWVar6->wc).nTerm;
      pWVar7 = (pWVar6->wc).a;
      local_338.pWInfo._0_4_ = *(undefined4 *)&pBuilder->pWInfo;
      local_338.pWInfo._4_4_ = *(undefined4 *)((long)&pBuilder->pWInfo + 4);
      local_338.pWC = pBuilder->pWC;
      local_338.pNew = pBuilder->pNew;
      local_338.bldFlags = pBuilder->bldFlags;
      local_338.iPlanLimit = pBuilder->iPlanLimit;
      local_338.pOrderBy = (ExprList *)0x0;
      local_338.pOrSet = &sCur;
      iVar10 = 0;
      bVar9 = true;
      for (pWVar12 = (pWVar6->wc).a; pWVar12 < pWVar7 + iVar3; pWVar12 = pWVar12 + 1) {
        if ((pWVar12->eOperator & 0x400) == 0) {
          if (pWVar12->leftCursor == iVar2) {
            tempWC.pWInfo = pWVar4->pWInfo;
            tempWC.op = ',';
            tempWC.nTerm = 1;
            local_338.pWC = &tempWC;
            tempWC.pOuter = pWVar4;
            tempWC.a = pWVar12;
            goto LAB_0017270f;
          }
        }
        else {
          local_338.pWC = *(WhereClause **)&pWVar12->u;
LAB_0017270f:
          sCur.n = 0;
          if ((pSVar5->a[bVar1].pTab)->nModuleArg == 0) {
            iVar10 = whereLoopAddBtree(&local_338,mPrereq);
          }
          else {
            iVar10 = whereLoopAddVirtual(&local_338,mPrereq,mUnusable);
          }
          if (iVar10 == 0) {
            iVar10 = whereLoopAddOr(&local_338,mPrereq,mUnusable);
          }
          uVar14 = (ulong)sCur.n;
          if (uVar14 == 0) {
            sSum._0_8_ = (ulong)(uint6)sSum._2_6_ << 0x10;
            uVar14 = 0;
            goto LAB_001728a9;
          }
          if (bVar9) {
            sSum.n = sCur.n;
            memcpy(sSum.a,sCur.a,(ulong)sCur.n << 4);
          }
          else {
            uVar18 = sSum._0_8_ & 0xffff;
            memcpy(&local_288,sSum.a,(sSum._0_8_ & 0xffff) << 4);
            sSum._0_8_ = sSum._0_8_ & 0xffffffffffff0000;
            for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
              pLVar17 = &sCur.a[0].nOut;
              for (uVar13 = 0; uVar13 < uVar14; uVar13 = uVar13 + 1) {
                uVar14 = ((WhereOrCost *)(pLVar17 + -5))->prereq;
                uVar8 = (&local_288)[uVar15 * 2];
                rRun = sqlite3LogEstAdd(local_280[uVar15 * 8],pLVar17[-1]);
                nOut = sqlite3LogEstAdd(local_280[uVar15 * 8 + 1],*pLVar17);
                whereOrInsert(&sSum,uVar14 | uVar8,rRun,nOut);
                uVar14 = (ulong)sCur.n;
                pLVar17 = pLVar17 + 8;
              }
            }
          }
          bVar9 = false;
        }
      }
      uVar14 = sSum._0_8_ & 0xffff;
LAB_001728a9:
      pTemplate->nLTerm = 1;
      *pTemplate->aLTerm = pWVar16;
      pTemplate->wsFlags = 0x2000;
      pTemplate->rSetup = 0;
      pTemplate->iSortIdx = '\0';
      *(undefined8 *)&pTemplate->u = 0;
      (pTemplate->u).btree.pIndex = (Index *)0x0;
      pLVar17 = &sSum.a[0].nOut;
      for (uVar18 = 0; (iVar10 == 0 && (uVar18 < uVar14)); uVar18 = uVar18 + 1) {
        pTemplate->rRun = (short)*(undefined4 *)(pLVar17 + -1) + 1;
        pTemplate->nOut = *pLVar17;
        pTemplate->prereq = ((WhereOrCost *)(pLVar17 + -5))->prereq;
        iVar10 = whereLoopInsert(pBuilder,pTemplate);
        pLVar17 = pLVar17 + 8;
      }
    }
    pWVar16 = pWVar16 + 1;
  } while( true );
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder, 
  Bitmask mPrereq, 
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  struct SrcList_item *pItem;
  
  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0 
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;
    
      sSubBuild = *pBuilder;
      sSubBuild.pOrderBy = 0;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x200, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x200, ("OR-term %d of %p has %d subterms:\n", 
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x400 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        assert( rc==SQLITE_OK || sCur.n==0 );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty 
        ** (equivalent to multiplying the cost by 1.07) to ensure that 
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x200, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}